

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matras.cc
# Opt level: O2

void * pta_alloc(matras_allocator *allocator)

{
  void *in_RAX;
  void *local_18;
  void *p;
  
  if (alloc_err_inj_enabled) {
    if (alloc_err_inj_countdown == 0) {
      return (void *)0x0;
    }
    alloc_err_inj_countdown = alloc_err_inj_countdown - 1;
    in_RAX = (void *)(ulong)alloc_err_inj_countdown;
  }
  local_18 = in_RAX;
  local_18 = operator_new__(0x40);
  AllocatedCount = AllocatedCount + 1;
  std::_Rb_tree<void*,void*,std::_Identity<void*>,std::less<void*>,std::allocator<void*>>::
  _M_insert_unique<void*const&>
            ((_Rb_tree<void*,void*,std::_Identity<void*>,std::less<void*>,std::allocator<void*>> *)
             &AllocatedBlocks,&local_18);
  return local_18;
}

Assistant:

static void *
pta_alloc(struct matras_allocator *allocator)
{
	(void)allocator;
	if (alloc_err_inj_enabled) {
		if (alloc_err_inj_countdown == 0)
			return 0;
		alloc_err_inj_countdown--;
	}
	void *p = new char[PROV_EXTENT_SIZE];
	AllocatedCount++;
	AllocatedBlocks.insert(p);
	return p;
}